

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitGlobalSet(Poppifier *this,GlobalSet *curr)

{
  Type this_00;
  bool bVar1;
  reference pvVar2;
  Global *pGVar3;
  size_t sVar4;
  Type *pTVar5;
  Expression *value;
  Index in_R8D;
  Name global;
  GlobalSet *local_78;
  uintptr_t local_70;
  Module *local_68;
  char *local_60;
  string_view local_58;
  GlobalSet *local_48;
  int local_3c;
  size_t sStack_38;
  Index i;
  char *local_30;
  Type local_28;
  Type types;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  GlobalSet *curr_local;
  Poppifier *this_local;
  
  pvVar2 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  types.id = (uintptr_t)&pvVar2->instrs;
  bVar1 = wasm::Type::isTuple(&curr->value->type);
  if (bVar1) {
    sStack_38 = (curr->name).super_IString.str._M_len;
    local_30 = (curr->name).super_IString.str._M_str;
    pGVar3 = Module::getGlobal(this->module,(Name)(curr->name).super_IString.str);
    local_28.id = (pGVar3->type).id;
    sVar4 = wasm::Type::size(&local_28);
    for (local_3c = (int)sVar4; this_00.id = types.id, local_3c != 0; local_3c = local_3c + -1) {
      local_68 = (Module *)(curr->name).super_IString.str._M_len;
      local_60 = (curr->name).super_IString.str._M_str;
      global.super_IString.str._M_str._0_4_ = local_3c + -1;
      global.super_IString.str._M_len = (size_t)local_60;
      global.super_IString.str._M_str._4_4_ = 0;
      local_58 = (string_view)getGlobalElem((anon_unknown_18 *)this->module,local_68,global,in_R8D);
      pTVar5 = wasm::Type::operator[](&local_28,(ulong)(local_3c - 1));
      local_70 = pTVar5->id;
      value = (Expression *)Builder::makePop(&this->builder,(Type)local_70);
      local_48 = Builder::makeGlobalSet(&this->builder,(Name)local_58,value);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00.id,
                 (value_type *)&local_48);
    }
  }
  else {
    poppify(this,(Expression *)curr);
    local_78 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)types.id,
               (value_type *)&local_78);
  }
  return;
}

Assistant:

void Poppifier::emitGlobalSet(GlobalSet* curr) {
  auto& instrs = scopeStack.back().instrs;
  if (curr->value->type.isTuple()) {
    auto types = module->getGlobal(curr->name)->type;
    for (Index i = types.size(); i > 0; --i) {
      instrs.push_back(
        builder.makeGlobalSet(getGlobalElem(module, curr->name, i - 1),
                              builder.makePop(types[i - 1])));
    }
  } else {
    poppify(curr);
    instrs.push_back(curr);
  }
}